

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQRESULT SVar5;
  SQObjectPtr *pSVar6;
  SQObjectPtr t;
  SQObjectPtr *self;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  
  if (v->_top - v->_stackbase < 2) {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar5 = -1;
  }
  else {
    bVar4 = sq_aux_gettypedarg(v,idx,OT_TABLE,&local_28);
    SVar5 = -1;
    if (bVar4) {
      pSVar6 = SQVM::GetUp(v,-1);
      local_38.super_SQObject._type = OT_NULL;
      local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
      bVar4 = SQTable::Get((local_28->super_SQObject)._unVal.pTable,pSVar6,&local_38);
      if (bVar4) {
        SQTable::Remove((local_28->super_SQObject)._unVal.pTable,pSVar6);
      }
      if (pushval == 0) {
        SQVM::Pop(v);
      }
      else {
        pSVar6 = SQVM::GetUp(v,-1);
        SVar2 = (pSVar6->super_SQObject)._type;
        pSVar3 = (pSVar6->super_SQObject)._unVal.pTable;
        (pSVar6->super_SQObject)._unVal.pTable = (SQTable *)local_38.super_SQObject._unVal;
        (pSVar6->super_SQObject)._type = local_38.super_SQObject._type;
        if ((local_38.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
      SQObjectPtr::~SQObjectPtr(&local_38);
      SVar5 = 0;
    }
  }
  return SVar5;
}

Assistant:

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    SQObjectPtr t;
    if(_table(*self)->Get(key,t)) {
        _table(*self)->Remove(key);
    }
    if(pushval != 0)
        v->GetUp(-1) = t;
    else
        v->Pop();
    return SQ_OK;
}